

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *
wasm::WATParser::locals<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
           *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  Lexer *this;
  _Uninitialized<wasm::Type,_true> _Var1;
  bool *this_00;
  undefined8 *puVar2;
  undefined1 uVar3;
  bool bVar4;
  bool bVar5;
  string_view expected;
  undefined1 auStack_108 [8];
  optional<wasm::Name> id;
  Result<wasm::Type> type;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  undefined1 auStack_88 [8];
  Result<wasm::Type> _val;
  undefined1 auStack_58 [8];
  LocalsT res;
  
  auStack_58 = (undefined1  [8])0x0;
  res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this = &ctx->in;
  bVar5 = false;
  this_00 = &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_engaged;
  do {
    expected._M_str = "local";
    expected._M_len = 5;
    bVar4 = Lexer::takeSExprStart(this,expected);
    if (!bVar4) {
      if (bVar5) {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> =
             auStack_58;
        *(pointer *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         8) = res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x10) = res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        auStack_58 = (undefined1  [8])0x0;
        res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\0';
      }
      else {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x01';
      }
LAB_00c2c952:
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)res.
                              super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      }
      return __return_storage_ptr__;
    }
    Lexer::takeID((optional<wasm::Name> *)auStack_108,this);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\0') {
      valtype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)this_00,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)auStack_88,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this_00);
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,auStack_88,
                   (undefined1 *)
                   ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                          _M_storage.id + (long)auStack_88));
LAB_00c2c8e5:
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> = puVar2;
        if (local_a8 == &local_98) {
          *puVar2 = CONCAT71(uStack_97,local_98);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
           + 0x18) = uStack_90;
        }
        else {
          *(undefined1 **)
           &(__return_storage_ptr__->val).
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> =
               local_a8;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                            .
                            super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                            .
                            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                            .
                            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                    + 0x10) = CONCAT71(uStack_97,local_98);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         8) = local_a0;
        local_a0 = 0;
        local_98 = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x02';
        local_a8 = &local_98;
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)auStack_88);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)auStack_88);
        bVar5 = Lexer::takeRParen(this);
        if (bVar5) {
          auStack_88 = auStack_108;
          _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
               (_Uninitialized<wasm::Type,_true>)
               (_Uninitialized<wasm::Type,_true>)
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
          ;
          _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ =
               id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_;
          if (res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_start ==
              res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::
            _M_realloc_insert<wasm::NameType>
                      ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_58,
                       (iterator)
                       res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                       _M_impl.super__Vector_impl_data._M_start,(NameType *)auStack_88);
          }
          else {
            ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_start)->type).id =
                 id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                 super__Optional_payload_base<wasm::Name>._16_8_;
            ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_start)->name).super_IString.str._M_len =
                 (size_t)auStack_108;
            ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
              super__Vector_impl_data._M_start)->name).super_IString.str._M_str =
                 (char *)id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.
                         str._M_len;
            res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
            super__Vector_impl_data._M_start =
                 res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
          }
          std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
          goto LAB_00c2c8b0;
        }
        type.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ = &local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),
                   "expected end of local","");
        Lexer::err((Err *)auStack_88,this,
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                         .
                         super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
                 + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).
          super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> = puVar2;
        _Var1._M_storage.id =
             (Type)((long)&_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                           super__Move_assign_alias<wasm::Type,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 8);
        if ((Type)auStack_88 == _Var1._M_storage.id) {
          *puVar2 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
           + 0x18) = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).
            super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
            .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> =
               auStack_88;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                   .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>
           + 0x10) = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_;
        }
        ((_Uninitialized<wasm::Type,_true> *)
        ((long)&(__return_storage_ptr__->val).
                super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> + 8
        ))->_M_storage =
             (Type)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::Type,_true>)(Type)0x0;
        _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
        super__Move_assign_alias<wasm::Type,_wasm::Err>.
        super__Copy_assign_alias<wasm::Type,_wasm::Err>.
        super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
        super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ =
             _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
             super__Move_assign_alias<wasm::Type,_wasm::Err>.
             super__Copy_assign_alias<wasm::Type,_wasm::Err>.
             super__Move_ctor_alias<wasm::Type,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
             super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ & 0xffffffffffffff00;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).
                 super__Variant_base<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>,_wasm::None,_wasm::Err>
                 .super__Move_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<std::vector<wasm::NameType>,_wasm::None,_wasm::Err> +
         0x20) = '\x02';
        auStack_88 = (undefined1  [8])_Var1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)type.val.super__Variant_base<wasm::Type,_wasm::Err>.
               super__Move_assign_alias<wasm::Type,_wasm::Err>.
               super__Copy_assign_alias<wasm::Type,_wasm::Err>.
               super__Move_ctor_alias<wasm::Type,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
               super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_ != &local_b8) {
          operator_delete((void *)type.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                                  super__Variant_storage_alias<wasm::Type,_wasm::Err>._32_8_,
                          local_b8._M_allocated_capacity + 1);
        }
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)
                 &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      goto LAB_00c2c952;
    }
    while (bVar5 = Lexer::takeRParen(this), !bVar5) {
      valtype<wasm::WATParser::ParseDefsCtx>((Result<wasm::Type> *)this_00,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Type,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)auStack_88,
                 (_Copy_ctor_base<false,_wasm::Type,_wasm::Err> *)this_00);
      uVar3 = _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
              super__Move_assign_alias<wasm::Type,_wasm::Err>.
              super__Copy_assign_alias<wasm::Type,_wasm::Err>.
              super__Move_ctor_alias<wasm::Type,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
              super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_;
      if (_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
          super__Move_assign_alias<wasm::Type,_wasm::Err>.
          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._24_1_ == '\x01') {
        local_a8 = &local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,auStack_88,
                   (undefined1 *)
                   ((long)_val.val.super__Variant_base<wasm::Type,_wasm::Err>.
                          super__Move_assign_alias<wasm::Type,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first.
                          _M_storage.id + (long)auStack_88));
        goto LAB_00c2c8e5;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)auStack_88);
      auStack_88 = (undefined1  [8])0x0;
      _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::Type,_true>)(Type)0x0;
      _val.val.super__Variant_base<wasm::Type,_wasm::Err>.
      super__Move_assign_alias<wasm::Type,_wasm::Err>.
      super__Copy_assign_alias<wasm::Type,_wasm::Err>.super__Move_ctor_alias<wasm::Type,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
      super__Variant_storage_alias<wasm::Type,_wasm::Err>._M_u._8_8_ =
           id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
      if (res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::
        _M_realloc_insert<wasm::NameType>
                  ((vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)auStack_58,
                   (iterator)
                   res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
                   super__Vector_impl_data._M_start,(NameType *)auStack_88);
      }
      else {
        ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_start)->type).id =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
        ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_start)->name).super_IString.str._M_len = 0;
        ((res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
          super__Vector_impl_data._M_start)->name).super_IString.str._M_str = (char *)0x0;
        res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start =
             res.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Type,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Type,_wasm::Err> *)this_00);
      if (uVar3 == '\x01') goto LAB_00c2c952;
    }
LAB_00c2c8b0:
    bVar5 = true;
  } while( true );
}

Assistant:

MaybeResult<typename Ctx::LocalsT> locals(Ctx& ctx) {
  bool hasAny = false;
  auto res = ctx.makeLocals();
  while (ctx.in.takeSExprStart("local"sv)) {
    hasAny = true;
    if (auto id = ctx.in.takeID()) {
      // Single named local
      auto type = valtype(ctx);
      CHECK_ERR(type);
      if (!ctx.in.takeRParen()) {
        return ctx.in.err("expected end of local");
      }
      ctx.appendLocal(res, *id, *type);
    } else {
      // Repeated unnamed locals
      while (!ctx.in.takeRParen()) {
        auto type = valtype(ctx);
        CHECK_ERR(type);
        ctx.appendLocal(res, {}, *type);
      }
    }
  }
  if (hasAny) {
    return res;
  }
  return {};
}